

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

char * from_string_nonull(JsonnetVm *vm,string *v,size_t *buflen)

{
  char *__dest;
  void *__src;
  size_t __n;
  double dVar1;
  JsonnetVm *in_RDX;
  char *r;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  char *pcVar2;
  
  std::__cxx11::string::length();
  __dest = jsonnet_realloc(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar2 = __dest;
  __src = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::length();
  memcpy(__dest,__src,__n);
  dVar1 = (double)std::__cxx11::string::length();
  in_RDX->gcGrowthTrigger = dVar1;
  return pcVar2;
}

Assistant:

static char *from_string_nonull(JsonnetVm *vm, const std::string &v, size_t *buflen)
{
    char *r = jsonnet_realloc(vm, nullptr, v.length());
    std::memcpy(r, v.data(), v.length());
    *buflen = v.length();
    return r;
}